

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevmousemanager.cpp
# Opt level: O0

void __thiscall QEvdevMouseManager::clampPosition(QEvdevMouseManager *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QScreen *in_RDI;
  long in_FS_OFFSET;
  QScreen *primaryScreen;
  QRect g;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QGuiApplication::primaryScreen();
  QScreen::virtualGeometry();
  QHighDpi::toNativePixels<QRect,QScreen>
            ((QRect *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
  iVar2 = *(int *)(in_RDI + 0x40) + *(int *)(in_RDI + 0x48);
  iVar3 = QRect::left((QRect *)0x107a8d);
  if (iVar2 < iVar3) {
    iVar2 = QRect::left((QRect *)0x107aa1);
    *(int *)(in_RDI + 0x40) = iVar2 - *(int *)(in_RDI + 0x48);
  }
  else {
    iVar2 = *(int *)(in_RDI + 0x40);
    iVar3 = *(int *)(in_RDI + 0x48);
    iVar4 = QRect::right((QRect *)0x107ac9);
    if (iVar4 < iVar2 + iVar3) {
      iVar2 = QRect::right((QRect *)0x107add);
      *(int *)(in_RDI + 0x40) = iVar2 - *(int *)(in_RDI + 0x48);
    }
  }
  iVar2 = *(int *)(in_RDI + 0x44);
  iVar3 = *(int *)(in_RDI + 0x4c);
  iVar4 = QRect::top((QRect *)0x107b05);
  if (iVar2 + iVar3 < iVar4) {
    iVar2 = QRect::top((QRect *)0x107b19);
    *(int *)(in_RDI + 0x44) = iVar2 - *(int *)(in_RDI + 0x4c);
  }
  else {
    iVar2 = *(int *)(in_RDI + 0x44);
    iVar3 = *(int *)(in_RDI + 0x4c);
    iVar4 = QRect::bottom((QRect *)0x107b41);
    if (iVar4 < iVar2 + iVar3) {
      iVar2 = QRect::bottom((QRect *)0x107b55);
      *(int *)(in_RDI + 0x44) = iVar2 - *(int *)(in_RDI + 0x4c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEvdevMouseManager::clampPosition()
{
    // clamp to screen geometry
    QScreen *primaryScreen = QGuiApplication::primaryScreen();
    QRect g = QHighDpi::toNativePixels(primaryScreen->virtualGeometry(), primaryScreen);
    if (m_x + m_xoffset < g.left())
        m_x = g.left() - m_xoffset;
    else if (m_x + m_xoffset > g.right())
        m_x = g.right() - m_xoffset;

    if (m_y + m_yoffset < g.top())
        m_y = g.top() - m_yoffset;
    else if (m_y + m_yoffset > g.bottom())
        m_y = g.bottom() - m_yoffset;
}